

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O0

qint64 __thiscall
QUdpSocket::writeDatagram
          (QUdpSocket *this,char *data,qint64 size,QHostAddress *address,quint16 port)

{
  bool bVar1;
  SocketState SVar2;
  SocketError errorCode;
  QAbstractSocketPrivate *this_00;
  qintptr qVar3;
  socklen_t in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QAbstractSocket *in_RDI;
  long in_FS_OFFSET;
  qint64 sent;
  QUdpSocketPrivate *d;
  undefined8 in_stack_fffffffffffffef8;
  BindFlag flags;
  QIpPacketHeader *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  SpecialAddress in_stack_ffffffffffffff0c;
  QAbstractSocketPrivate *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  quint16 bindPort;
  QAbstractSocketEngine *pQVar4;
  QHostAddress *in_stack_ffffffffffffff20;
  QUdpSocketPrivate *in_stack_ffffffffffffff28;
  long local_78;
  uint local_3c;
  undefined1 local_30 [40];
  long local_8;
  
  bindPort = (quint16)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  flags = (BindFlag)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &d_func((QUdpSocket *)0x266c01)->super_QAbstractSocketPrivate;
  QHostAddress::QHostAddress((QHostAddress *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  bVar1 = QUdpSocketPrivate::doEnsureInitialized
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,bindPort,
                     (QHostAddress *)in_stack_ffffffffffffff10);
  QHostAddress::~QHostAddress((QHostAddress *)0x266c4e);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    SVar2 = QAbstractSocket::state((QAbstractSocket *)0x266c73);
    if (SVar2 == UnconnectedState) {
      QFlags<QAbstractSocket::BindFlag>::QFlags
                ((QFlags<QAbstractSocket::BindFlag> *)in_stack_ffffffffffffff00,flags);
      QAbstractSocket::bind(in_RDI,0,(sockaddr *)(ulong)local_3c,in_ECX);
    }
    pQVar4 = this_00->socketEngine;
    QIpPacketHeader::QIpPacketHeader
              ((QIpPacketHeader *)in_stack_ffffffffffffff10,
               (QHostAddress *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (quint16)((ulong)in_stack_ffffffffffffff00 >> 0x30));
    local_78 = (**(code **)(*(long *)pQVar4 + 0x100))(pQVar4,in_RSI,in_RDX,local_30);
    QIpPacketHeader::~QIpPacketHeader(in_stack_ffffffffffffff00);
    qVar3 = (**(code **)(*(long *)this_00->socketEngine + 0x70))();
    this_00->cachedSocketDescriptor = qVar3;
    if (local_78 < 0) {
      if (local_78 == -2) {
        tr((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
           (char *)in_stack_ffffffffffffff00,flags);
        QAbstractSocketPrivate::setErrorAndEmit
                  (this_00,in_stack_ffffffffffffff0c,(QString *)in_stack_ffffffffffffff00);
        QString::~QString((QString *)0x266da5);
        local_78 = -1;
      }
      else {
        errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x266dce);
        QAbstractSocketEngine::errorString
                  ((QAbstractSocketEngine *)CONCAT44(errorCode,in_stack_ffffffffffffff08));
        QAbstractSocketPrivate::setErrorAndEmit
                  (in_stack_ffffffffffffff10,errorCode,(QString *)this_00);
        QString::~QString((QString *)0x266e0e);
      }
    }
    else {
      QIODevice::bytesWritten((longlong)in_RDI);
    }
  }
  else {
    local_78 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_78;
}

Assistant:

qint64 QUdpSocket::writeDatagram(const char *data, qint64 size, const QHostAddress &address,
                                  quint16 port)
{
    Q_D(QUdpSocket);
#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::writeDatagram(%p, %llu, \"%s\", %i)", data, size,
           address.toString().toLatin1().constData(), port);
#endif
    if (!d->doEnsureInitialized(QHostAddress::Any, 0, address))
        return -1;
    if (state() == UnconnectedState)
        bind();

    qint64 sent = d->socketEngine->writeDatagram(data, size, QIpPacketHeader(address, port));
    d->cachedSocketDescriptor = d->socketEngine->socketDescriptor();

    if (sent >= 0) {
        emit bytesWritten(sent);
    } else {
        if (sent == -2) {
            // Socket engine reports EAGAIN. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("Unable to send a datagram"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return sent;
}